

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

double soplex::LPFreadInfinity<double>(char **pos)

{
  long lVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  double dVar16;
  
  cVar2 = **pos;
  pcVar14 = *pos + 1;
  *pos = pcVar14;
  iVar11 = 0;
  iVar12 = 0;
  do {
    lVar9 = (long)iVar11;
    cVar3 = "inf[inity]"[lVar9];
    if (cVar3 == '[') {
      pcVar6 = "inf[inity]" + (iVar11 + 1);
      lVar13 = 0;
      iVar7 = iVar11;
      do {
        iVar11 = iVar7;
        pcVar15 = pcVar6;
        cVar3 = pcVar14[lVar13 + iVar12];
        iVar8 = tolower((int)cVar3);
        lVar1 = lVar13 + 1;
        if (cVar3 == '\0') break;
        lVar5 = lVar13 + lVar9 + 1;
        pcVar6 = pcVar15 + 1;
        lVar13 = lVar1;
        iVar7 = iVar11 + 1;
      } while (iVar8 == "inf[inity]"[lVar5]);
      do {
        iVar11 = iVar11 + 1;
        cVar3 = *pcVar15;
        pcVar15 = pcVar15 + 1;
      } while (cVar3 != ']');
      iVar12 = iVar12 + (int)lVar1 + -2;
    }
    else {
      if (cVar3 == '\0') goto LAB_00178ff5;
      iVar7 = tolower((int)pcVar14[iVar12]);
      if (iVar7 != cVar3) {
        if (cVar3 == '\0') {
LAB_00178ff5:
          bVar4 = pcVar14[iVar12];
          if ((((ulong)bVar4 < 0x21) && ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
             ((byte)(bVar4 - 0x3c) < 3)) {
            *pos = pcVar14 + iVar12;
          }
        }
        ::soplex::infinity::__tls_init();
        pdVar10 = (double *)__tls_get_addr(&PTR_003b6b60);
        dVar16 = *pdVar10;
        if (cVar2 == '-') {
          dVar16 = -dVar16;
        }
        return dVar16;
      }
    }
    iVar11 = iVar11 + 1;
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

static R LPFreadInfinity(char*& pos)
{
   assert(LPFisInfinity(pos));

   R sense = (*pos == '-') ? -1.0 : 1.0;

   (void) LPFhasKeyword(++pos, "inf[inity]");

   return sense * R(infinity);
}